

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

bool transform_rellocs(vector<char,_std::allocator<char>_> *raw,
                      vector<explode::rellocation,_std::allocator<explode::rellocation>_> *out)

{
  size_t this;
  ostream *this_00;
  rellocation local_50;
  uint16_t local_4c;
  uint16_t local_4a;
  uint16_t seg;
  anon_union_8_2_f8194b7f aStack_48;
  uint16_t rel;
  anon_union_8_2_f8194b7f u;
  char *seg_b;
  char *rel_b;
  size_t i;
  size_t sz;
  vector<explode::rellocation,_std::allocator<explode::rellocation>_> *out_local;
  vector<char,_std::allocator<char>_> *raw_local;
  
  sz = (size_t)out;
  out_local = (vector<explode::rellocation,_std::allocator<explode::rellocation>_> *)raw;
  i = std::vector<char,_std::allocator<char>_>::size(raw);
  if ((i & 3) == 0) {
    for (rel_b = (char *)0x0; rel_b < (char *)(i >> 2); rel_b = rel_b + 1) {
      seg_b = std::vector<char,_std::allocator<char>_>::operator[](raw,(long)rel_b << 2);
      aStack_48.bytes =
           std::vector<char,_std::allocator<char>_>::operator[](raw,(long)rel_b * 4 + 2);
      this = sz;
      local_4a = *(uint16_t *)seg_b;
      local_4c = *aStack_48.words;
      u.words = aStack_48.words;
      explode::rellocation::rellocation(&local_50,local_4c,local_4a);
      std::vector<explode::rellocation,_std::allocator<explode::rellocation>_>::push_back
                ((vector<explode::rellocation,_std::allocator<explode::rellocation>_> *)this,
                 &local_50);
    }
    raw_local._7_1_ = true;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,
                              "rellocations area size should be divisible by 4");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    raw_local._7_1_ = false;
  }
  return raw_local._7_1_;
}

Assistant:

static bool transform_rellocs(const std::vector <char> raw, std::vector <explode::rellocation>& out)
{
	const std::size_t sz = raw.size();
	if (sz % 4)
	{
		std::cout << "rellocations area size should be divisible by 4" << std::endl;
		return false;
	}
	for (std::size_t i = 0; i < sz / 4; i++)
	{
		const char* rel_b = &raw[4 * i];
		const char* seg_b = &raw[4 * i + 2];
		union
		{
			const uint16_t* words;
			const char*     bytes;
		} u;
		u.bytes = rel_b;
		uint16_t rel = *u.words;
		u.bytes = seg_b;
		uint16_t seg = *u.words;
		out.push_back(explode::rellocation(seg, rel));
	}
	return true;
}